

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O2

Gia_Man_t *
Gia_ManResub1(char *pFileName,int nNodes,int nSupp,int nDivs,int iChoice,int fUseXor,int fVerbose,
             int fVeryVerbose)

{
  bool bVar1;
  char cVar2;
  uint uVar3;
  FILE *__stream;
  Vec_Wrd_t *vSims;
  Vec_Ptr_t *vDivs;
  Gia_ResbMan_t *p;
  Vec_Wec_t *p_00;
  Vec_Int_t *vVec1;
  Gia_Man_t *pGVar4;
  int iVar5;
  ulong Entry;
  int iVar6;
  uint nWords;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    vSims = (Vec_Wrd_t *)0x0;
    printf("Cannot open file \"%s\" for reading.\n",pFileName);
    nWords = 0;
    vDivs = (Vec_Ptr_t *)0x0;
  }
  else {
    vSims = Vec_WrdAlloc(1000);
    iVar6 = 0;
    nWords = 0xffffffff;
    Entry = 0;
    while( true ) {
      do {
        do {
          uVar3 = fgetc(__stream);
        } while (uVar3 == 9);
      } while ((uVar3 == 0xd) || (uVar3 == 0x20));
      if (uVar3 == 0xffffffff) break;
      if (uVar3 == 10) {
        if (0 < iVar6) {
          Vec_WrdPush(vSims,Entry);
          iVar6 = 0;
          Entry = 0;
        }
        if ((nWords == 0xffffffff) && (nWords = vSims->nSize, (int)nWords < 1)) {
          nWords = 0xffffffff;
        }
      }
      else {
        cVar2 = (char)uVar3;
        iVar5 = -0x30;
        if (((9 < (byte)(cVar2 - 0x30U)) && (iVar5 = -0x37, 5 < (byte)(cVar2 + 0xbfU))) &&
           (iVar5 = -0x57, 5 < (byte)(cVar2 + 0x9fU))) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                        ,0x506,"int Vec_WrdReadHexOne(char)");
        }
        Entry = (ulong)((uVar3 & 0xff) + iVar5) << ((char)iVar6 * '\x04' & 0x3fU) | Entry;
        bVar1 = 0xe < iVar6;
        iVar6 = iVar6 + 1;
        if (bVar1) {
          Vec_WrdPush(vSims,Entry);
          iVar6 = 0;
          Entry = 0;
        }
      }
    }
    iVar6 = vSims->nSize;
    if (iVar6 % (int)nWords != 0) {
      __assert_fail("Vec_WrdSize(p) % nWords == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                    ,0x52c,"Vec_Wrd_t *Vec_WrdReadHex(char *, int *, int)");
    }
    fclose(__stream);
    printf("Read %d words of simulation data for %d objects.\n",(ulong)nWords,
           (long)iVar6 / (long)(int)nWords & 0xffffffff);
    vDivs = Gia_ManDeriveDivs(vSims,nWords);
  }
  p = Gia_ResbAlloc(nWords);
  if (0x3fff < vDivs->nSize) {
    printf("Reducing all divs from %d to %d.\n",(ulong)(uint)vDivs->nSize,0x3fff);
    if (vDivs->nSize < 0x3fff) {
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                    ,0x232,"void Vec_PtrShrink(Vec_Ptr_t *, int)");
    }
    vDivs->nSize = 0x3fff;
  }
  Gia_ManResubPerform(p,vDivs,nWords,100,0x32,iChoice,fUseXor,1,1);
  if (p->vGates->nSize == 0) {
    puts("Decomposition did not succeed.");
    pGVar4 = (Gia_Man_t *)0x0;
  }
  else {
    p_00 = Vec_WecStart(1);
    vVec1 = Vec_WecEntry(p_00,0);
    Vec_IntAppend(vVec1,p->vGates);
    pGVar4 = Gia_ManConstructFromGates(p_00,vDivs->nSize);
    Vec_WecFree(p_00);
  }
  Gia_ResbFree(p);
  Vec_PtrFree(vDivs);
  Vec_WrdFree(vSims);
  return pGVar4;
}

Assistant:

Gia_Man_t * Gia_ManResub1( char * pFileName, int nNodes, int nSupp, int nDivs, int iChoice, int fUseXor, int fVerbose, int fVeryVerbose )
{
    int nWords = 0;
    Gia_Man_t * pMan   = NULL;
    Vec_Wrd_t * vSims  = Vec_WrdReadHex( pFileName, &nWords, 1 );
    Vec_Ptr_t * vDivs  = vSims ? Gia_ManDeriveDivs( vSims, nWords ) : NULL;
    Gia_ResbMan_t * p = Gia_ResbAlloc( nWords );
    //Gia_ManCheckResub( vDivs, nWords );
    if ( Vec_PtrSize(vDivs) >= (1<<14) )
    {
        printf( "Reducing all divs from %d to %d.\n", Vec_PtrSize(vDivs), (1<<14)-1 );
        Vec_PtrShrink( vDivs, (1<<14)-1 );
    }
    assert( Vec_PtrSize(vDivs) < (1<<14) );
    Gia_ManResubPerform( p, vDivs, nWords, 100, 50, iChoice, fUseXor, 1, 1 );
    if ( Vec_IntSize(p->vGates) )
    {
        Vec_Wec_t * vGates = Vec_WecStart(1);
        Vec_IntAppend( Vec_WecEntry(vGates, 0), p->vGates );
        pMan = Gia_ManConstructFromGates( vGates, Vec_PtrSize(vDivs) );
        Vec_WecFree( vGates );
    }
    else
        printf( "Decomposition did not succeed.\n" );
    Gia_ResbFree( p );
    Vec_PtrFree( vDivs );
    Vec_WrdFree( vSims );
    return pMan;
}